

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O1

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  pointer *ppNVar1;
  undefined8 *puVar2;
  pointer pNVar3;
  Module *this_00;
  uintptr_t uVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  Type *pTVar10;
  Type *pTVar11;
  undefined8 *puVar12;
  Function *pFVar13;
  Export *pEVar14;
  Table *pTVar15;
  CallIndirect *pCVar16;
  undefined1 reuse;
  Type in_RCX;
  ulong uVar17;
  pointer pNVar18;
  uint __len;
  Id IVar19;
  uint __val;
  Type *__range1;
  Signature sig_00;
  string_view sVar20;
  Name NVar21;
  string_view sVar22;
  Name name;
  undefined1 auStack_288 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_f8;
  HeapType funcType_local;
  Type local_e8;
  Expression *local_e0;
  Address local_d8;
  Expression *local_d0;
  Builder local_c8;
  Builder builder;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  char *local_88;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_80;
  undefined1 auStack_78 [8];
  Iterator __begin1_1;
  undefined1 auStack_58 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  
  local_f8.id = funcType.id;
  _f = HeapType::getSignature(&local_f8);
  bVar7 = wasm::Type::isTuple(&sig.params);
  if (bVar7) {
    Fatal::Fatal((Fatal *)auStack_288);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               "GenerateDynCalls: Cannot operate on multiple return values:",0x3b);
    Fatal::operator<<((Fatal *)auStack_288,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_288);
  }
  if (this->onlyI64 == true) {
    auStack_288 = (undefined1  [8])
                  f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)sig.params.id;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])&args;
    sVar9 = wasm::Type::size((Type *)&args);
    in_RCX.id = (ulong)auStack_58 ^ (ulong)&args |
                (ulong)namedParams.
                       super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                       super__Vector_impl_data._M_start ^ sVar9;
    bVar7 = in_RCX.id == 0;
    if (!bVar7) {
      pTVar10 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      if (pTVar10->id != 3) {
        do {
          namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&((namedParams.
                                  super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name).super_IString.
                                str._M_len + 1);
          in_RCX.id = (ulong)namedParams.
                             super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                             _M_impl.super__Vector_impl_data._M_start ^ sVar9;
          bVar7 = auStack_58 == (undefined1  [8])&args && in_RCX.id == 0;
          if (bVar7) goto LAB_006fd1ba;
          pTVar10 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
        } while (pTVar10->id != 3);
      }
      if (!bVar7) goto LAB_006fd237;
    }
LAB_006fd1ba:
    pTVar10 = (Type *)auStack_288;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])pTVar10;
    sVar9 = wasm::Type::size(pTVar10);
    in_RCX.id = (ulong)auStack_58 ^ (ulong)pTVar10 |
                (ulong)namedParams.
                       super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                       super__Vector_impl_data._M_start ^ sVar9;
    bVar7 = in_RCX.id != 0;
    if ((bVar7) &&
       (pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_58), pTVar11->id != 3)) {
      do {
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)&((namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                              _M_len + 1);
        in_RCX.id = (ulong)namedParams.
                           super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                           _M_impl.super__Vector_impl_data._M_start ^ sVar9;
        bVar7 = auStack_58 != (undefined1  [8])pTVar10 || in_RCX.id != 0;
        if (auStack_58 == (undefined1  [8])pTVar10 && in_RCX.id == 0) break;
        pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
      } while (pTVar11->id != 3);
    }
    if (!bVar7) {
      return;
    }
  }
LAB_006fd237:
  this_00 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
            ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
            .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
            currModule;
  ppNVar1 = &namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_c8.wasm = this_00;
  auStack_58 = (undefined1  [8])ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"dynCall_","");
  getSig_abi_cxx11_((string *)&sig.results,(wasm *)sig.params.id,
                    (Type)f._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,in_RCX);
  pNVar3 = (pointer)((long)&((namedParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                            _M_len +
                    (long)&(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start)->id);
  pNVar18 = (pointer)0xf;
  if (auStack_58 != (undefined1  [8])ppNVar1) {
    pNVar18 = namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar18 < pNVar3) {
    pNVar18 = (pointer)0xf;
    if ((pointer *)sig.results.id !=
        &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      pNVar18 = (pointer)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    if (pNVar3 <= pNVar18) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&sig.results,0,(char *)0x0,(ulong)auStack_58);
      goto LAB_006fd2e8;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append(auStack_58,sig.results.id);
LAB_006fd2e8:
  auStack_288 = (undefined1  [8])
                &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = puVar12 + 2;
  if ((pointer *)*puVar12 == (pointer *)puVar2) {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar12[3];
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_288 = (undefined1  [8])*puVar12;
  }
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar12[1];
  *puVar12 = puVar2;
  puVar12[1] = 0;
  *(undefined1 *)puVar2 = 0;
  sVar20._M_str = (char *)0x0;
  sVar20._M_len = (size_t)auStack_288;
  sVar20 = IString::interned((IString *)
                             args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,sVar20,SUB81(puVar2,0));
  if (auStack_288 !=
      (undefined1  [8])
      &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_288,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if ((pointer *)sig.results.id !=
      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)sig.results.id,
                    (ulong)((long)&(params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (auStack_58 != (undefined1  [8])ppNVar1) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&((namedParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  pFVar13 = Module::getFunctionOrNull(this_00,(Name)sVar20);
  if ((pFVar13 == (Function *)0x0) &&
     (pEVar14 = Module::getExportOrNull(this_00,(Name)sVar20), pEVar14 == (Export *)0x0)) {
    auStack_58 = (undefined1  [8])0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.results.id = 0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_288._0_4_ = 2;
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<char_const(&)[5],wasm::Type::BasicType>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_58,
               (char (*) [5])"fptr",(BasicType *)auStack_288);
    auStack_288 = (undefined1  [8])0x2;
    if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&sig.results,
                 (iterator)
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,(Type *)auStack_288);
    }
    else {
      (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 2;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    auStack_78 = (undefined1  [8])&f;
    pTVar10 = (Type *)wasm::Type::size((Type *)&f);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar10) || (auStack_78 != (undefined1  [8])&f)) {
      __val = 0;
      do {
        pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
        __len = 1;
        if (9 < __val) {
          uVar17 = (ulong)__val;
          uVar6 = 4;
          do {
            __len = uVar6;
            uVar8 = (uint)uVar17;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_006fd502;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_006fd502;
            }
            if (uVar8 < 10000) goto LAB_006fd502;
            uVar17 = uVar17 / 10000;
            uVar6 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_006fd502:
        auStack_288 = (undefined1  [8])
                      &args.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct((ulong)auStack_288,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)auStack_288,__len,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_288,
                   pTVar11);
        if (auStack_288 !=
            (undefined1  [8])
            &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_288,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,
                     (iterator)
                     params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,pTVar11);
        }
        else {
          (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = pTVar11->id;
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __val = __val + 1;
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                parent != pTVar10) || (auStack_78 != (undefined1  [8])&f));
    }
    Tuple::Tuple((Tuple *)auStack_288,(TypeList *)&sig.results);
    wasm::Type::Type(&local_e8,(Tuple *)auStack_288);
    sig_00.results.id = sig.params.id;
    sig_00.params.id = local_e8.id;
    HeapType::HeapType(&funcType_local,sig_00);
    auStack_78 = (undefined1  [8])0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    local_88 = (char *)sVar20._M_len;
    local_80 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)sVar20._M_str;
    NVar21.super_IString.str._M_str = local_88;
    NVar21.super_IString.str._M_len = (size_t)&builder;
    Builder::makeFunction
              (NVar21,local_80,(HeapType)auStack_58,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)funcType_local.id,
               (Expression *)auStack_78);
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,
                      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                      .index - (long)auStack_78);
    }
    if (auStack_288 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_288,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
    }
    local_d0 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
    local_d0->_id = LocalGetId;
    local_d0[1]._id = InvalidId;
    (local_d0->type).id = 2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_288 = (undefined1  [8])0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    auStack_78 = (undefined1  [8])&f;
    pTVar10 = (Type *)wasm::Type::size((Type *)&f);
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar10) || (auStack_78 != (undefined1  [8])&f)) {
      IVar19 = BlockId;
      do {
        do {
          pTVar11 = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
          uVar4 = pTVar11->id;
          local_e0 = (Expression *)MixedArena::allocSpace(&(local_c8.wasm)->allocator,0x18,8);
          local_e0->_id = LocalGetId;
          local_e0[1]._id = IVar19;
          (local_e0->type).id = uVar4;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_288,
                     &local_e0);
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          IVar19 = IVar19 + BlockId;
        } while (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 parent != pTVar10);
      } while (auStack_78 != (undefined1  [8])&f);
    }
    if ((this_00->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      NVar21 = Name::fromInt(0);
      wasm::Type::Type((Type *)&local_d8,(HeapType)0x1,Nullable);
      name.super_IString.str._M_str = NVar21.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)auStack_78;
      Builder::makeTable(name,(Type)NVar21.super_IString.str._M_str,local_d8,(Address)0x0);
      reuse = (undefined1)local_d8.addr;
      pTVar15 = Module::addTable(this_00,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                          *)auStack_78);
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78,0x50);
      }
      pcVar5 = DAT_00dbd8a0;
      (pTVar15->super_Importable).module.super_IString.str._M_len = ENV;
      (pTVar15->super_Importable).module.super_IString.str._M_str = pcVar5;
      sVar22 = IString::interned((IString *)0x19,(string_view)ZEXT816(0xb75ebe),(bool)reuse);
      (pTVar15->super_Importable).base.super_IString.str = sVar22;
    }
    pCVar16 = Builder::
              makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        (&local_c8,
                         (IString)*(IString *)
                                   (((this_00->tables).
                                     super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                   ._M_t,local_d0,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_288,local_f8,false);
    ((builder.wasm)->elementSegments).
    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar16;
    Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                                &builder);
    pFVar13 = Module::getFunctionOrNull(this_00,(Name)sVar20);
    if (pFVar13 == (Function *)0x0) {
      __assert_fail("!must_export",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GenerateDynCalls.cpp"
                    ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
    }
    pEVar14 = Module::getExportOrNull(this_00,(Name)sVar20);
    if (pEVar14 == (Export *)0x0) {
      pEVar14 = (Export *)operator_new(0x28);
      (pEVar14->value).super_IString.str._M_len = 0;
      (pEVar14->value).super_IString.str._M_str = (char *)0x0;
      (pEVar14->value).super_IString.str._M_len = (size_t)local_88;
      (pEVar14->value).super_IString.str._M_str = (char *)local_80;
      (pEVar14->name).super_IString.str._M_len = (pEVar14->value).super_IString.str._M_len;
      (pEVar14->name).super_IString.str._M_str = (pEVar14->value).super_IString.str._M_str;
      pEVar14->kind = Function;
      Module::addExport(this_00,pEVar14);
    }
    if (auStack_288 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_288,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
    }
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder);
    if (sig.results.id != 0) {
      operator_delete((void *)sig.results.id,
                      (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - sig.results.id);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)namedParams.
                            super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  namedParams.emplace_back("fptr", Type::i32); // function pointer param
  params.push_back(Type::i32);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  Expression* fptr = builder.makeLocalGet(0, Type::i32);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
  }
  f->body =
    builder.makeCallIndirect(wasm->tables[0]->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}